

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineCacheTests.cpp
# Opt level: O3

TestCaseGroup * vkt::pipeline::createCacheTests(TestContext *testCtx)

{
  pointer pcVar1;
  size_type sVar2;
  size_type sVar3;
  _Alloc_hider _Var4;
  TestNode *pTVar5;
  TestNode *pTVar6;
  long *plVar7;
  long lVar8;
  size_type __dnew;
  size_type __dnew_1;
  CacheTestParam testParams [3];
  allocator<char> local_13a;
  allocator<char> local_139;
  TestContext *local_138;
  CommandLine *local_130;
  undefined1 local_128 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  _Alloc_hider local_f0;
  long *local_e8 [2];
  long local_d8 [2];
  long *local_c8 [2];
  long local_b8 [2];
  _Alloc_hider *local_a8;
  TestContext *local_a0;
  _Alloc_hider _Stack_98;
  size_type local_90 [2];
  undefined **local_80;
  undefined8 local_78;
  undefined4 local_70;
  undefined8 local_60;
  undefined **local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_38;
  
  local_f0._M_p = (pointer)operator_new(0x70);
  local_128._16_8_ = testCtx;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_f0._M_p,testCtx,"cache","pipeline cache tests");
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,(TestContext *)local_128._16_8_,"graphics_tests",
             "Test pipeline cache with graphics pipeline.");
  local_a8 = (_Alloc_hider *)&PTR__CacheTestParam_00d26ec0;
  local_a0 = (TestContext *)0x1000000001;
  local_90[1] = 2;
  local_80 = &PTR__CacheTestParam_00d26ec0;
  local_78 = 0x800000001;
  local_70 = 0x10;
  local_60 = 3;
  local_58 = &PTR__CacheTestParam_00d26ec0;
  local_50 = 0x200000001;
  uStack_48 = 0x1000000004;
  local_38 = 4;
  lVar8 = 0;
  do {
    pTVar6 = (TestNode *)operator_new(0x98);
    plVar7 = (long *)((long)&local_a8 + lVar8);
    (**(code **)(*plVar7 + 0x10))(local_128 + 0x18,plVar7);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_138,(char *)local_128._24_8_,&local_139);
    (**(code **)(*plVar7 + 0x18))(local_e8,plVar7);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_c8,(char *)local_e8[0],&local_13a);
    tcu::TestCase::TestCase
              ((TestCase *)pTVar6,(TestContext *)local_128._16_8_,(char *)local_138,
               (char *)local_c8[0]);
    pTVar6[1]._vptr_TestNode = (_func_int **)&PTR__CacheTestParam_00d26ec0;
    pcVar1 = *(pointer *)((long)&_Stack_98._M_p + lVar8);
    sVar2 = *(size_type *)((long)local_90 + lVar8);
    sVar3 = *(size_type *)((long)local_90 + lVar8 + 8);
    pTVar6[1].m_testCtx = *(TestContext **)((long)&local_a0 + lVar8);
    pTVar6[1].m_name._M_dataplus._M_p = pcVar1;
    pTVar6[1].m_name._M_string_length = sVar2;
    pTVar6[1].m_name.field_2._M_allocated_capacity = sVar3;
    pTVar6->_vptr_TestNode = (_func_int **)&PTR__CacheTest_00d26f90;
    if (local_c8[0] != local_b8) {
      operator_delete(local_c8[0],local_b8[0] + 1);
    }
    if (local_e8[0] != local_d8) {
      operator_delete(local_e8[0],local_d8[0] + 1);
    }
    if (local_138 != (TestContext *)local_128) {
      operator_delete(local_138,(ulong)((long)(_func_int ***)local_128._0_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._24_8_ != &local_100) {
      operator_delete((void *)local_128._24_8_,(ulong)(local_100._M_allocated_capacity + 1));
    }
    tcu::TestNode::addChild(pTVar5,pTVar6);
    lVar8 = lVar8 + 0x28;
  } while (lVar8 != 0x78);
  tcu::TestNode::addChild((TestNode *)local_f0._M_p,pTVar5);
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,(TestContext *)local_128._16_8_,"pipeline_from_get_data",
             "Test pipeline cache with graphics pipeline.");
  local_a8 = (_Alloc_hider *)&PTR__CacheTestParam_00d26ec0;
  local_a0 = (TestContext *)0x1000000001;
  local_90[1] = 2;
  local_80 = &PTR__CacheTestParam_00d26ec0;
  local_78 = 0x800000001;
  local_70 = 0x10;
  local_60 = 3;
  local_58 = &PTR__CacheTestParam_00d26ec0;
  local_50 = 0x200000001;
  uStack_48 = 0x1000000004;
  local_38 = 4;
  lVar8 = 0;
  do {
    pTVar6 = (TestNode *)operator_new(0x98);
    plVar7 = (long *)((long)&local_a8 + lVar8);
    (**(code **)(*plVar7 + 0x10))(local_128 + 0x18,plVar7);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_138,(char *)local_128._24_8_,&local_139);
    (**(code **)(*plVar7 + 0x18))(local_e8,plVar7);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_c8,(char *)local_e8[0],&local_13a);
    tcu::TestCase::TestCase
              ((TestCase *)pTVar6,(TestContext *)local_128._16_8_,(char *)local_138,
               (char *)local_c8[0]);
    pTVar6[1]._vptr_TestNode = (_func_int **)&PTR__CacheTestParam_00d26ec0;
    pcVar1 = *(pointer *)((long)&_Stack_98._M_p + lVar8);
    sVar2 = *(size_type *)((long)local_90 + lVar8);
    sVar3 = *(size_type *)((long)local_90 + lVar8 + 8);
    pTVar6[1].m_testCtx = *(TestContext **)((long)&local_a0 + lVar8);
    pTVar6[1].m_name._M_dataplus._M_p = pcVar1;
    pTVar6[1].m_name._M_string_length = sVar2;
    pTVar6[1].m_name.field_2._M_allocated_capacity = sVar3;
    pTVar6->_vptr_TestNode = (_func_int **)&PTR__CacheTest_00d27228;
    if (local_c8[0] != local_b8) {
      operator_delete(local_c8[0],local_b8[0] + 1);
    }
    if (local_e8[0] != local_d8) {
      operator_delete(local_e8[0],local_d8[0] + 1);
    }
    if (local_138 != (TestContext *)local_128) {
      operator_delete(local_138,(ulong)((long)(_func_int ***)local_128._0_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._24_8_ != &local_100) {
      operator_delete((void *)local_128._24_8_,(ulong)(local_100._M_allocated_capacity + 1));
    }
    tcu::TestNode::addChild(pTVar5,pTVar6);
    lVar8 = lVar8 + 0x28;
  } while (lVar8 != 0x78);
  tcu::TestNode::addChild((TestNode *)local_f0._M_p,pTVar5);
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,(TestContext *)local_128._16_8_,
             "pipeline_from_incomplete_get_data","Test pipeline cache with graphics pipeline.");
  local_a8 = (_Alloc_hider *)&PTR__CacheTestParam_00d26ec0;
  local_a0 = (TestContext *)0x1000000001;
  local_90[1] = 2;
  local_80 = &PTR__CacheTestParam_00d26ec0;
  local_78 = 0x800000001;
  local_70 = 0x10;
  local_60 = 3;
  local_58 = &PTR__CacheTestParam_00d26ec0;
  local_50 = 0x200000001;
  uStack_48 = 0x1000000004;
  local_38 = 4;
  lVar8 = 0;
  do {
    pTVar6 = (TestNode *)operator_new(0x98);
    plVar7 = (long *)((long)&local_a8 + lVar8);
    (**(code **)(*plVar7 + 0x10))(local_128 + 0x18,plVar7);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_138,(char *)local_128._24_8_,&local_139);
    (**(code **)(*plVar7 + 0x18))(local_e8,plVar7);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_c8,(char *)local_e8[0],&local_13a);
    tcu::TestCase::TestCase
              ((TestCase *)pTVar6,(TestContext *)local_128._16_8_,(char *)local_138,
               (char *)local_c8[0]);
    pTVar6[1]._vptr_TestNode = (_func_int **)&PTR__CacheTestParam_00d26ec0;
    pcVar1 = *(pointer *)((long)&_Stack_98._M_p + lVar8);
    sVar2 = *(size_type *)((long)local_90 + lVar8);
    sVar3 = *(size_type *)((long)local_90 + lVar8 + 8);
    pTVar6[1].m_testCtx = *(TestContext **)((long)&local_a0 + lVar8);
    pTVar6[1].m_name._M_dataplus._M_p = pcVar1;
    pTVar6[1].m_name._M_string_length = sVar2;
    pTVar6[1].m_name.field_2._M_allocated_capacity = sVar3;
    pTVar6->_vptr_TestNode = (_func_int **)&PTR__CacheTest_00d272d8;
    if (local_c8[0] != local_b8) {
      operator_delete(local_c8[0],local_b8[0] + 1);
    }
    if (local_e8[0] != local_d8) {
      operator_delete(local_e8[0],local_d8[0] + 1);
    }
    if (local_138 != (TestContext *)local_128) {
      operator_delete(local_138,(ulong)((long)(_func_int ***)local_128._0_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._24_8_ != &local_100) {
      operator_delete((void *)local_128._24_8_,(ulong)(local_100._M_allocated_capacity + 1));
    }
    tcu::TestNode::addChild(pTVar5,pTVar6);
    lVar8 = lVar8 + 0x28;
  } while (lVar8 != 0x78);
  tcu::TestNode::addChild((TestNode *)local_f0._M_p,pTVar5);
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,(TestContext *)local_128._16_8_,"compute_tests",
             "Test pipeline cache with compute pipeline.");
  local_a8 = (_Alloc_hider *)&PTR__CacheTestParam_00d26ec0;
  local_a0 = (TestContext *)CONCAT44(local_a0._4_4_,0x20);
  local_90[1] = 1;
  pTVar6 = (TestNode *)operator_new(0x98);
  (anonymous_namespace)::CacheTestParam::generateTestName_abi_cxx11_
            ((string *)(local_128 + 0x18),&local_a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,(char *)local_128._24_8_,&local_139);
  (*(code *)local_a8[3]._M_p)(local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c8,(char *)local_e8[0],&local_13a);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,(TestContext *)local_128._16_8_,(char *)local_138,
             (char *)local_c8[0]);
  pTVar6[1]._vptr_TestNode = (_func_int **)&PTR__CacheTestParam_00d26ec0;
  pTVar6[1].m_testCtx = local_a0;
  pTVar6[1].m_name._M_dataplus._M_p = _Stack_98._M_p;
  pTVar6[1].m_name._M_string_length = local_90[0];
  pTVar6[1].m_name.field_2._M_allocated_capacity = local_90[1];
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__CacheTest_00d27388;
  if (local_c8[0] != local_b8) {
    operator_delete(local_c8[0],local_b8[0] + 1);
  }
  if (local_e8[0] != local_d8) {
    operator_delete(local_e8[0],local_d8[0] + 1);
  }
  if (local_138 != (TestContext *)local_128) {
    operator_delete(local_138,(ulong)((long)(_func_int ***)local_128._0_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._24_8_ != &local_100) {
    operator_delete((void *)local_128._24_8_,(ulong)(local_100._M_allocated_capacity + 1));
  }
  tcu::TestNode::addChild(pTVar5,pTVar6);
  tcu::TestNode::addChild((TestNode *)local_f0._M_p,pTVar5);
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,(TestContext *)local_128._16_8_,"misc_tests",
             "Misc tests that can not be categorized to other group.");
  pTVar6 = (TestNode *)operator_new(0x98);
  local_138 = (TestContext *)0x10;
  local_a8 = &_Stack_98;
  local_a8 = (_Alloc_hider *)std::__cxx11::string::_M_create((ulong *)&local_a8,(ulong)&local_138);
  _Stack_98._M_p = (pointer)local_138;
  local_a8->_M_p = (pointer)0x61635f656772656d;
  local_a8[1]._M_p = (pointer)0x747365745f656863;
  local_a0 = local_138;
  *(undefined1 *)((long)&local_138->m_platform + (long)&local_a8->_M_p) = 0;
  local_138 = (TestContext *)local_128;
  local_128._24_8_ = (CommandLine *)0x16;
  local_138 = (TestContext *)
              std::__cxx11::string::_M_create((ulong *)&local_138,(ulong)(local_128 + 0x18));
  local_128._0_8_ = local_128._24_8_;
  local_138->m_platform = (Platform *)0x687420656772654d;
  local_138->m_rootArchive = (Archive *)0x7365686361632065;
  *(undefined8 *)((long)&local_138->m_rootArchive + 6) = 0x2e74736574207365;
  local_130 = (CommandLine *)local_128._24_8_;
  *(char *)((long)(_func_int ***)local_128._24_8_ + (long)&local_138->m_platform) = '\0';
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,(TestContext *)local_128._16_8_,(char *)local_a8,(char *)local_138);
  pTVar6[1]._vptr_TestNode = (_func_int **)&PTR__CacheTestParam_00d26ec0;
  pTVar6[1].m_testCtx = (TestContext *)0x1000000001;
  pTVar6[1].m_name.field_2._M_allocated_capacity = 2;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__CacheTest_00d26f00;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  if (local_138 != (TestContext *)local_128) {
    operator_delete(local_138,(ulong)((long)(_func_int ***)local_128._0_8_ + 1));
  }
  if (local_a8 != &_Stack_98) {
    operator_delete(local_a8,(ulong)(_Stack_98._M_p + 1));
  }
  pTVar6 = (TestNode *)operator_new(0x98);
  local_138 = (TestContext *)0x11;
  local_a8 = &_Stack_98;
  local_a8 = (_Alloc_hider *)std::__cxx11::string::_M_create((ulong *)&local_a8,(ulong)&local_138);
  _Stack_98._M_p = (pointer)local_138;
  local_a8->_M_p = (pointer)0x65685f6568636163;
  local_a8[1]._M_p = (pointer)0x7365745f72656461;
  *(undefined1 *)&local_a8[2]._M_p = 0x74;
  local_a0 = local_138;
  *(undefined1 *)((long)&local_138->m_platform + (long)&local_a8->_M_p) = 0;
  local_138 = (TestContext *)local_128;
  local_128._24_8_ = (CommandLine *)0x12;
  local_138 = (TestContext *)
              std::__cxx11::string::_M_create((ulong *)&local_138,(ulong)(local_128 + 0x18));
  local_128._0_8_ = local_128._24_8_;
  local_138->m_platform = (Platform *)0x6568206568636143;
  local_138->m_rootArchive = (Archive *)0x7365742072656461;
  *(undefined2 *)&local_138->m_log = 0x2e74;
  local_130 = (CommandLine *)local_128._24_8_;
  *(char *)((long)(_func_int ***)local_128._24_8_ + (long)&local_138->m_platform) = '\0';
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,(TestContext *)local_128._16_8_,(char *)local_a8,(char *)local_138);
  pTVar6[1]._vptr_TestNode = (_func_int **)&PTR__CacheTestParam_00d26ec0;
  pTVar6[1].m_testCtx = (TestContext *)0x1000000001;
  pTVar6[1].m_name.field_2._M_allocated_capacity = 2;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__CacheTest_00d270c8;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  if (local_138 != (TestContext *)local_128) {
    operator_delete(local_138,(ulong)((long)(_func_int ***)local_128._0_8_ + 1));
  }
  if (local_a8 != &_Stack_98) {
    operator_delete(local_a8,(ulong)(_Stack_98._M_p + 1));
  }
  pTVar6 = (TestNode *)operator_new(0x98);
  local_138 = (TestContext *)0x11;
  local_a8 = &_Stack_98;
  local_a8 = (_Alloc_hider *)std::__cxx11::string::_M_create((ulong *)&local_a8,(ulong)&local_138);
  _Stack_98._M_p = (pointer)local_138;
  local_a8->_M_p = (pointer)0x5f64696c61766e69;
  local_a8[1]._M_p = (pointer)0x7365745f657a6973;
  *(undefined1 *)&local_a8[2]._M_p = 0x74;
  local_a0 = local_138;
  *(undefined1 *)((long)&local_138->m_platform + (long)&local_a8->_M_p) = 0;
  local_138 = (TestContext *)local_128;
  local_128._24_8_ = (CommandLine *)0x12;
  local_138 = (TestContext *)
              std::__cxx11::string::_M_create((ulong *)&local_138,(ulong)(local_128 + 0x18));
  local_128._0_8_ = local_128._24_8_;
  local_138->m_platform = (Platform *)0x2064696c61766e49;
  local_138->m_rootArchive = (Archive *)0x73657420657a6973;
  *(undefined2 *)&local_138->m_log = 0x2e74;
  local_130 = (CommandLine *)local_128._24_8_;
  *(char *)((long)(_func_int ***)local_128._24_8_ + (long)&local_138->m_platform) = '\0';
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,(TestContext *)local_128._16_8_,(char *)local_a8,(char *)local_138);
  pTVar6[1]._vptr_TestNode = (_func_int **)&PTR__CacheTestParam_00d26ec0;
  pTVar6[1].m_testCtx = (TestContext *)0x1000000001;
  pTVar6[1].m_name.field_2._M_allocated_capacity = 2;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__CacheTest_00d27178;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  if (local_138 != (TestContext *)local_128) {
    operator_delete(local_138,(ulong)((long)(_func_int ***)local_128._0_8_ + 1));
  }
  if (local_a8 != &_Stack_98) {
    operator_delete(local_a8,(ulong)(_Stack_98._M_p + 1));
  }
  _Var4._M_p = local_f0._M_p;
  tcu::TestNode::addChild((TestNode *)local_f0._M_p,pTVar5);
  return (TestCaseGroup *)(TestNode *)_Var4._M_p;
}

Assistant:

tcu::TestCaseGroup* createCacheTests (tcu::TestContext& testCtx)
{

	de::MovePtr<tcu::TestCaseGroup> cacheTests (new tcu::TestCaseGroup(testCtx, "cache", "pipeline cache tests"));

	// Graphics Pipeline Tests
	{
		de::MovePtr<tcu::TestCaseGroup> graphicsTests (new tcu::TestCaseGroup(testCtx, "graphics_tests", "Test pipeline cache with graphics pipeline."));

		const VkShaderStageFlagBits testParamShaders0[] =
		{
			VK_SHADER_STAGE_VERTEX_BIT,
			VK_SHADER_STAGE_FRAGMENT_BIT,
		};
		const VkShaderStageFlagBits testParamShaders1[] =
		{
			VK_SHADER_STAGE_VERTEX_BIT,
			VK_SHADER_STAGE_GEOMETRY_BIT,
			VK_SHADER_STAGE_FRAGMENT_BIT,
		};
		const VkShaderStageFlagBits testParamShaders2[] =
		{
			VK_SHADER_STAGE_VERTEX_BIT,
			VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,
			VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT,
			VK_SHADER_STAGE_FRAGMENT_BIT,
		};
		const CacheTestParam testParams[] =
		{
			CacheTestParam(testParamShaders0, DE_LENGTH_OF_ARRAY(testParamShaders0)),
			CacheTestParam(testParamShaders1, DE_LENGTH_OF_ARRAY(testParamShaders1)),
			CacheTestParam(testParamShaders2, DE_LENGTH_OF_ARRAY(testParamShaders2)),
		};

		for (deUint32 i = 0; i < DE_LENGTH_OF_ARRAY(testParams); i++)
			graphicsTests->addChild(newTestCase<GraphicsCacheTest>(testCtx, &testParams[i]));

		cacheTests->addChild(graphicsTests.release());
	}

	// Graphics Pipeline Tests
	{
		de::MovePtr<tcu::TestCaseGroup> graphicsTests(new tcu::TestCaseGroup(testCtx, "pipeline_from_get_data", "Test pipeline cache with graphics pipeline."));

		const VkShaderStageFlagBits testParamShaders0[] =
		{
			VK_SHADER_STAGE_VERTEX_BIT,
			VK_SHADER_STAGE_FRAGMENT_BIT,
		};
		const VkShaderStageFlagBits testParamShaders1[] =
		{
			VK_SHADER_STAGE_VERTEX_BIT,
			VK_SHADER_STAGE_GEOMETRY_BIT,
			VK_SHADER_STAGE_FRAGMENT_BIT,
		};
		const VkShaderStageFlagBits testParamShaders2[] =
		{
			VK_SHADER_STAGE_VERTEX_BIT,
			VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,
			VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT,
			VK_SHADER_STAGE_FRAGMENT_BIT,
		};
		const CacheTestParam testParams[] =
		{
			CacheTestParam(testParamShaders0, DE_LENGTH_OF_ARRAY(testParamShaders0)),
			CacheTestParam(testParamShaders1, DE_LENGTH_OF_ARRAY(testParamShaders1)),
			CacheTestParam(testParamShaders2, DE_LENGTH_OF_ARRAY(testParamShaders2)),
		};

		for (deUint32 i = 0; i < DE_LENGTH_OF_ARRAY(testParams); i++)
			graphicsTests->addChild(newTestCase<PipelineFromCacheTest>(testCtx, &testParams[i]));

		cacheTests->addChild(graphicsTests.release());
	}

	// Graphics Pipeline Tests
	{
		de::MovePtr<tcu::TestCaseGroup> graphicsTests(new tcu::TestCaseGroup(testCtx, "pipeline_from_incomplete_get_data", "Test pipeline cache with graphics pipeline."));

		const VkShaderStageFlagBits testParamShaders0[] =
		{
			VK_SHADER_STAGE_VERTEX_BIT,
			VK_SHADER_STAGE_FRAGMENT_BIT,
		};
		const VkShaderStageFlagBits testParamShaders1[] =
		{
			VK_SHADER_STAGE_VERTEX_BIT,
			VK_SHADER_STAGE_GEOMETRY_BIT,
			VK_SHADER_STAGE_FRAGMENT_BIT,
		};
		const VkShaderStageFlagBits testParamShaders2[] =
		{
			VK_SHADER_STAGE_VERTEX_BIT,
			VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,
			VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT,
			VK_SHADER_STAGE_FRAGMENT_BIT,
		};
		const CacheTestParam testParams[] =
		{
			CacheTestParam(testParamShaders0, DE_LENGTH_OF_ARRAY(testParamShaders0)),
			CacheTestParam(testParamShaders1, DE_LENGTH_OF_ARRAY(testParamShaders1)),
			CacheTestParam(testParamShaders2, DE_LENGTH_OF_ARRAY(testParamShaders2)),
		};

		for (deUint32 i = 0; i < DE_LENGTH_OF_ARRAY(testParams); i++)
			graphicsTests->addChild(newTestCase<PipelineFromIncompleteCacheTest>(testCtx, &testParams[i]));

		cacheTests->addChild(graphicsTests.release());
	}

	// Compute Pipeline Tests
	{
		de::MovePtr<tcu::TestCaseGroup> computeTests (new tcu::TestCaseGroup(testCtx, "compute_tests", "Test pipeline cache with compute pipeline."));

		const VkShaderStageFlagBits testParamShaders0[] =
		{
			VK_SHADER_STAGE_COMPUTE_BIT,
		};
		const CacheTestParam testParams[] =
		{
			CacheTestParam(testParamShaders0, DE_LENGTH_OF_ARRAY(testParamShaders0)),
		};

		for (deUint32 i = 0; i < DE_LENGTH_OF_ARRAY(testParams); i++)
			computeTests->addChild(newTestCase<ComputeCacheTest>(testCtx, &testParams[i]));

		cacheTests->addChild(computeTests.release());
	}

	// Misc Tests
	{
		de::MovePtr<tcu::TestCaseGroup> miscTests (new tcu::TestCaseGroup(testCtx, "misc_tests", "Misc tests that can not be categorized to other group."));

		const VkShaderStageFlagBits testParamShaders[] =
		{
			VK_SHADER_STAGE_VERTEX_BIT,
			VK_SHADER_STAGE_FRAGMENT_BIT,
		};

		const CacheTestParam testParam(testParamShaders, DE_LENGTH_OF_ARRAY(testParamShaders));
		miscTests->addChild(new MergeCacheTest(testCtx,
											   "merge_cache_test",
											   "Merge the caches test.",
											   &testParam));

		miscTests->addChild(new CacheHeaderTest(testCtx,
											   "cache_header_test",
											   "Cache header test.",
											   &testParam));

		miscTests->addChild(new InvalidSizeTest(testCtx,
												"invalid_size_test",
												"Invalid size test.",
												&testParam));

		cacheTests->addChild(miscTests.release());
	}

	return cacheTests.release();
}